

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

void __thiscall inja::Parser::parse_into(Parser *this,Template *tmpl,string_view path)

{
  string_view path_00;
  string_view path_01;
  bool bVar1;
  string local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  allocator local_459;
  string local_458;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  allocator local_3d1;
  string local_3d0;
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  allocator local_349;
  string local_348;
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  allocator local_2c1;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  allocator local_239;
  string local_238;
  Parser *local_218;
  const_pointer local_210;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  allocator local_1a1;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  allocator local_119;
  string local_118;
  Parser *local_f8;
  const_pointer local_f0;
  uint local_e8;
  Op local_e2;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  string_view local_38;
  Template *local_28;
  Template *tmpl_local;
  Parser *this_local;
  string_view path_local;
  
  path_local.data_ = (const_pointer)path.size_;
  this_local = (Parser *)path.data_;
  local_28 = tmpl;
  tmpl_local = (Template *)this;
  nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
  basic_string_view<std::allocator<char>>
            ((basic_string_view<char,std::char_traits<char>> *)&local_38,&tmpl->content);
  Lexer::start(&this->m_lexer,local_38);
  do {
    get_next_token(this);
    switch((this->m_tok).kind) {
    case Text:
      local_e2 = PrintText;
      local_e8 = 0;
      std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
      emplace_back<inja::Bytecode::Op,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>&,unsigned_int>
                ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)local_28,&local_e2,
                 &(this->m_tok).text,&local_e8);
      break;
    case ExpressionOpen:
      get_next_token(this);
      bVar1 = parse_expression(this,local_28);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2c0,"parser_error",&local_2c1);
        Token::describe_abi_cxx11_(&local_328,&this->m_tok);
        std::operator+(&local_308,"expected expression, got \'",&local_328);
        std::operator+(&local_2e8,&local_308,"\'");
        inja_throw(&local_2c0,&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      }
      append_function(this,local_28,PrintValue,1);
      if ((this->m_tok).kind != ExpressionClose) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_348,"parser_error",&local_349);
        Token::describe_abi_cxx11_(&local_3b0,&this->m_tok);
        std::operator+(&local_390,"expected expression close, got \'",&local_3b0);
        std::operator+(&local_370,&local_390,"\'");
        inja_throw(&local_348,&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_348);
        std::allocator<char>::~allocator((allocator<char> *)&local_349);
      }
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_458,"parser_error",&local_459);
      Token::describe_abi_cxx11_(&local_4c0,&this->m_tok);
      std::operator+(&local_4a0,"unexpected token \'",&local_4c0);
      std::operator+(&local_480,&local_4a0,"\'");
      inja_throw(&local_458,&local_480);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator((allocator<char> *)&local_459);
      break;
    case LineStatementOpen:
      get_next_token(this);
      local_218 = this_local;
      local_210 = path_local.data_;
      path_00.size_ = (size_type)path_local.data_;
      path_00.data_ = (const_pointer)this_local;
      parse_statement(this,local_28,path_00);
      if (((this->m_tok).kind != LineStatementClose) && ((this->m_tok).kind != Eof)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_238,"parser_error",&local_239);
        Token::describe_abi_cxx11_(&local_2a0,&this->m_tok);
        std::operator+(&local_280,"expected line statement close, got \'",&local_2a0);
        std::operator+(&local_260,&local_280,"\'");
        inja_throw(&local_238,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator((allocator<char> *)&local_239);
      }
      break;
    case StatementOpen:
      get_next_token(this);
      local_f8 = this_local;
      local_f0 = path_local.data_;
      path_01.size_ = (size_type)path_local.data_;
      path_01.data_ = (const_pointer)this_local;
      bVar1 = parse_statement(this,local_28,path_01);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_118,"parser_error",&local_119);
        Token::describe_abi_cxx11_(&local_180,&this->m_tok);
        std::operator+(&local_160,"expected statement, got \'",&local_180);
        std::operator+(&local_140,&local_160,"\'");
        inja_throw(&local_118,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
      }
      if ((this->m_tok).kind != StatementClose) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1a0,"parser_error",&local_1a1);
        Token::describe_abi_cxx11_(&local_208,&this->m_tok);
        std::operator+(&local_1e8,"expected statement close, got \'",&local_208);
        std::operator+(&local_1c8,&local_1e8,"\'");
        inja_throw(&local_1a0,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      }
      break;
    case CommentOpen:
      get_next_token(this);
      if ((this->m_tok).kind != CommentClose) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3d0,"parser_error",&local_3d1);
        Token::describe_abi_cxx11_(&local_438,&this->m_tok);
        std::operator+(&local_418,"expected comment close, got \'",&local_438);
        std::operator+(&local_3f8,&local_418,"\'");
        inja_throw(&local_3d0,&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      }
      break;
    case Eof:
      bVar1 = std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::empty
                        (&this->m_if_stack);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_58,"parser_error",&local_59);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_90,"unmatched if",&local_91);
        inja_throw(&local_58,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        std::__cxx11::string::~string((string *)&local_58);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
      }
      bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_loop_stack);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b8,"parser_error",&local_b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e0,"unmatched for",&local_e1);
        inja_throw(&local_b8,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      }
      return;
    }
  } while( true );
}

Assistant:

void parse_into(Template& tmpl, nonstd::string_view path) {
		m_lexer.start(tmpl.content);

		for (;;) {
			get_next_token();
			switch (m_tok.kind) {
				case Token::Kind::Eof:
					if (!m_if_stack.empty()) inja_throw("parser_error", "unmatched if");
					if (!m_loop_stack.empty()) inja_throw("parser_error", "unmatched for");
					return;
				case Token::Kind::Text:
					tmpl.bytecodes.emplace_back(Bytecode::Op::PrintText, m_tok.text, 0u);
					break;
				case Token::Kind::StatementOpen:
					get_next_token();
					if (!parse_statement(tmpl, path)) {
						inja_throw("parser_error", "expected statement, got '" + m_tok.describe() + "'");
					}
					if (m_tok.kind != Token::Kind::StatementClose) {
						inja_throw("parser_error", "expected statement close, got '" + m_tok.describe() + "'");
					}
					break;
				case Token::Kind::LineStatementOpen:
					get_next_token();
					parse_statement(tmpl, path);
					if (m_tok.kind != Token::Kind::LineStatementClose && m_tok.kind != Token::Kind::Eof) {
						inja_throw("parser_error", "expected line statement close, got '" + m_tok.describe() + "'");
					}
					break;
				case Token::Kind::ExpressionOpen:
					get_next_token();
					if (!parse_expression(tmpl)) {
						inja_throw("parser_error", "expected expression, got '" + m_tok.describe() + "'");
					}
					append_function(tmpl, Bytecode::Op::PrintValue, 1);
					if (m_tok.kind != Token::Kind::ExpressionClose) {
						inja_throw("parser_error", "expected expression close, got '" + m_tok.describe() + "'");
					}
					break;
				case Token::Kind::CommentOpen:
					get_next_token();
					if (m_tok.kind != Token::Kind::CommentClose) {
						inja_throw("parser_error", "expected comment close, got '" + m_tok.describe() + "'");
					}
					break;
				default:
					inja_throw("parser_error", "unexpected token '" + m_tok.describe() + "'");
					break;
			}
		}
	}